

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O0

bool __thiscall
FactorisedJoin::seekValue
          (FactorisedJoin *this,DTreeNode *node,int *rel,int *ordering,int numOfRel,int **l,int *u,
          double *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference ppdVar5;
  int iVar6;
  long in_RCX;
  int *in_RDX;
  long in_RSI;
  FactorisedJoin *in_RDI;
  int in_R8D;
  long *in_R9;
  long in_stack_00000008;
  double *in_stack_00000010;
  int mid;
  int low;
  int high;
  int leap;
  double min;
  double max;
  int j;
  int i;
  int index;
  int nodeID;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  
  iVar1 = *(int *)(in_RSI + 0x20);
  iVar3 = mod(in_RDI,*in_RDX + -1,in_R8D);
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (in_RDI->_ids + iVar1,(long)*(int *)(in_RCX + (long)iVar3 * 4));
  iVar2 = pvVar4->first;
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (in_RDI->_ids + iVar1,(long)*(int *)(in_RCX + (long)iVar3 * 4));
  iVar3 = pvVar4->second;
  ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                      (in_RDI->_data + iVar2,(long)*(int *)(*in_R9 + (long)iVar2 * 4));
  local_50 = (*ppdVar5)[iVar3];
  do {
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RDI->_ids + iVar1,(long)*(int *)(in_RCX + (long)*in_RDX * 4));
    iVar2 = pvVar4->first;
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RDI->_ids + iVar1,(long)*(int *)(in_RCX + (long)*in_RDX * 4));
    iVar3 = pvVar4->second;
    ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        (in_RDI->_data + iVar2,(long)*(int *)(*in_R9 + (long)iVar2 * 4));
    local_58 = (*ppdVar5)[iVar3];
    if ((local_58 == local_50) && (!NAN(local_58) && !NAN(local_50))) {
      *in_stack_00000010 = local_58;
      return false;
    }
    ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        (in_RDI->_data + iVar2,(long)*(int *)(in_stack_00000008 + (long)iVar2 * 4));
    if ((*ppdVar5)[iVar3] <= local_50 && local_50 != (*ppdVar5)[iVar3]) {
      return true;
    }
    local_5c = 1;
    while (*(int *)(*in_R9 + (long)iVar2 * 4) <= *(int *)(in_stack_00000008 + (long)iVar2 * 4) &&
           local_58 < local_50) {
      if (*(int *)(in_stack_00000008 + (long)iVar2 * 4) <=
          *(int *)(*in_R9 + (long)iVar2 * 4) + local_5c) {
        local_5c = *(int *)(in_stack_00000008 + (long)iVar2 * 4) -
                   *(int *)(*in_R9 + (long)iVar2 * 4);
        *(undefined4 *)(*in_R9 + (long)iVar2 * 4) =
             *(undefined4 *)(in_stack_00000008 + (long)iVar2 * 4);
        std::vector<double_*,_std::allocator<double_*>_>::operator[]
                  (in_RDI->_data + iVar2,(long)*(int *)(*in_R9 + (long)iVar2 * 4));
        break;
      }
      *(int *)(*in_R9 + (long)iVar2 * 4) = local_5c + *(int *)(*in_R9 + (long)iVar2 * 4);
      ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          (in_RDI->_data + iVar2,(long)*(int *)(*in_R9 + (long)iVar2 * 4));
      local_58 = (*ppdVar5)[iVar3];
      if (local_58 < local_50) {
        local_5c = local_5c << 1;
      }
    }
    if ((1 < local_5c) &&
       (ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            (in_RDI->_data + iVar2,(long)(*(int *)(*in_R9 + (long)iVar2 * 4) + -1)),
       local_50 <= (*ppdVar5)[iVar3])) {
      local_60 = *(int *)(*in_R9 + (long)iVar2 * 4);
      local_64 = *(int *)(*in_R9 + (long)iVar2 * 4) - local_5c;
      while (local_64 < local_60 && local_60 != local_64) {
        iVar6 = (local_60 + local_64) / 2;
        ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            (in_RDI->_data + iVar2,(long)(iVar6 + -1));
        if (((*ppdVar5)[iVar3] <= local_50 && local_50 != (*ppdVar5)[iVar3]) &&
           (ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                (in_RDI->_data + iVar2,(long)iVar6), local_50 <= (*ppdVar5)[iVar3]))
        {
          *(int *)(*in_R9 + (long)iVar2 * 4) = iVar6;
          break;
        }
        ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            (in_RDI->_data + iVar2,(long)iVar6);
        if ((*ppdVar5)[iVar3] < local_50) {
          local_64 = iVar6 + 1;
        }
        else {
          local_60 = iVar6 + -1;
        }
      }
      local_68 = (local_60 + local_64) / 2;
      ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          (in_RDI->_data + iVar2,(long)(local_68 + -1));
      if (local_50 <= (*ppdVar5)[iVar3]) {
        local_68 = local_68 + -1;
      }
      *(int *)(*in_R9 + (long)iVar2 * 4) = local_68;
    }
    ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        (in_RDI->_data + iVar2,(long)*(int *)(*in_R9 + (long)iVar2 * 4));
    local_50 = (*ppdVar5)[iVar3];
    *in_RDX = (*in_RDX + 1) % in_R8D;
  } while( true );
}

Assistant:

bool FactorisedJoin::seekValue(DTreeNode* node, int &rel, int* ordering, int numOfRel,
                               int* &l, int* u, double &val)
{
    int nodeID = node->_id;

    int index = mod(rel - 1, numOfRel);
    int i = _ids[nodeID][ordering[index]].first;
    int j = _ids[nodeID][ordering[index]].second;

    /* this is the value we are seeking. */
    double max = _data[i][l[i]][j];

    double min;
    while (true)
    {
        i = _ids[nodeID][ordering[rel]].first;
        j = _ids[nodeID][ordering[rel]].second;
        min = _data[i][l[i]][j];

        /* If we found the value then we return. */
        if (min == max)
        {
            val = min;
            return false;
        }
        /* else we seek a the least upper bound */
        else
        {
            /* If the value we seek is bigger than the last value in the
             * relation we can return. */
            if (max > _data[i][u[i]][j])
                return true;

            /* We seek the value with increasing leaps. */
            int leap = 1;
            while (l[i] <= u[i] && min < max)
            {
                if (l[i] + leap < u[i])
                {
                    l[i] += leap;
                    min = _data[i][l[i]][j];
                    if (min < max)
                        leap *= 2;
                }
                else
                {
                    leap = u[i] - l[i];
                    l[i] = u[i];
                    min = _data[i][l[i]][j];
                    break;
                }
            }

            /*
             * When we found an upper bound we need to find the least upper bound;
             * we backtrack using binary search.
             */
            if (leap > 1 && max <= _data[i][l[i] - 1][j])
            {
                int high = l[i], low = l[i] - leap, mid = 0;
                while (high > low && high != low)
                {
                    mid = (high + low) / 2;
                    if (max > _data[i][mid - 1][j] && max <= _data[i][mid][j])
                    {
                        l[i] = mid;
                        break;
                    }
                    else if (max <= _data[i][mid][j])
                        high = mid - 1;
                    else
                        low = mid + 1;
                }

                mid = (high + low) / 2;
                if (_data[i][mid - 1][j] >= max)
                    mid -= 1;

                l[i] = mid;
            }

            /*
             * Once the least upper bound is found we set max to that value and
             * continue with the next relation.
             */
            max = _data[i][l[i]][j];
            rel = (rel + 1) % numOfRel;
        }
    }

    return false;
}